

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O1

bool __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::positiveHasPlusSign
          (PropertiesAffixPatternProvider *this)

{
  bool bVar1;
  bool bVar2;
  ErrorCode localStatus;
  ErrorCode local_28;
  
  local_28._vptr_ErrorCode = (_func_int **)&PTR__ErrorCode_003ad908;
  local_28.errorCode = U_ZERO_ERROR;
  bVar1 = AffixUtils::containsType(&this->posPrefix,TYPE_PLUS_SIGN,&local_28.errorCode);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = AffixUtils::containsType(&this->posSuffix,TYPE_PLUS_SIGN,&local_28.errorCode);
  }
  ErrorCode::~ErrorCode(&local_28);
  return bVar2;
}

Assistant:

bool PropertiesAffixPatternProvider::positiveHasPlusSign() const {
    // TODO: Change the internal APIs to propagate out the error?
    ErrorCode localStatus;
    return AffixUtils::containsType(posPrefix, TYPE_PLUS_SIGN, localStatus) ||
           AffixUtils::containsType(posSuffix, TYPE_PLUS_SIGN, localStatus);
}